

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  reference pQVar3;
  StringReverser *this;
  ColorToGray *this_00;
  exception *e;
  QPDFWriter w;
  shared_ptr<QPDFObjectHandle::TokenFilter> local_b8;
  shared_ptr<QPDFObjectHandle::TokenFilter> local_a8;
  reference local_98;
  QPDFPageObjectHelper *page;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_60 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_48;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  QPDF local_30 [8];
  QPDF pdf;
  char *outfilename;
  char *infilename;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc != 3) {
    usage();
  }
  pcVar1 = argv[1];
  _pdf = argv[2];
  QPDF::QPDF(local_30);
  QPDF::processFile((char *)local_30,pcVar1);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1,local_30);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_48 = local_60;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_48)
  ;
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_48);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&page);
    if (!bVar2) break;
    pQVar3 = __gnu_cxx::
             __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
             ::operator*(&__end1);
    local_98 = pQVar3;
    this = (StringReverser *)operator_new(0x10);
    StringReverser::StringReverser(this);
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::shared_ptr<StringReverser,void>(&local_a8,this);
    QPDFPageObjectHelper::addContentTokenFilter(pQVar3,&local_a8);
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::~shared_ptr(&local_a8);
    pQVar3 = local_98;
    this_00 = (ColorToGray *)operator_new(0xb0);
    ColorToGray::ColorToGray(this_00);
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::shared_ptr<ColorToGray,void>(&local_b8,this_00);
    QPDFPageObjectHelper::addContentTokenFilter(pQVar3,&local_b8);
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::~shared_ptr(&local_b8);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_60);
  QPDFWriter::QPDFWriter((QPDFWriter *)&e,local_30,_pdf);
  QPDFWriter::setStaticID(SUB81(&e,0));
  QPDFWriter::setQDFMode(SUB81(&e,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter((QPDFWriter *)&e);
  QPDF::~QPDF(local_30);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 3) {
        usage();
    }
    char const* infilename = argv[1];
    char const* outfilename = argv[2];

    try {
        QPDF pdf;
        pdf.processFile(infilename);
        for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
            // Attach two token filters to each page of this file. When the file is written, or when
            // the pages' contents are retrieved in any other way, the filters will be applied. See
            // comments on the filters for additional details.
            page.addContentTokenFilter(
                std::shared_ptr<QPDFObjectHandle::TokenFilter>(new StringReverser));
            page.addContentTokenFilter(
                std::shared_ptr<QPDFObjectHandle::TokenFilter>(new ColorToGray));
        }

        QPDFWriter w(pdf, outfilename);
        w.setStaticID(true); // for testing only
        w.setQDFMode(true);
        w.write();
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}